

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelpMessages.cpp
# Opt level: O2

string * ApprovalTests::HelpMessages::envVarErrorMessage
                   (string *__return_storage_ptr__,string *envVarName,string *selected,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *knowns,string *helpMessage)

{
  pointer pbVar1;
  string *__return_storage_ptr___00;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *known;
  pointer pbVar3;
  allocator local_291;
  string local_290;
  string *local_270;
  string *local_268;
  string *local_260;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  stringstream ss;
  ostream local_1a8;
  
  local_270 = __return_storage_ptr__;
  local_268 = envVarName;
  local_260 = selected;
  ::std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  pbVar1 = (knowns->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar3 = (knowns->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar1; pbVar3 = pbVar3 + 1) {
    poVar2 = ::std::operator<<(&local_1a8,"* ");
    poVar2 = ::std::operator<<(poVar2,(string *)pbVar3);
    ::std::operator<<(poVar2,'\n');
  }
  ::std::__cxx11::string::string((string *)&local_1d8,(string *)helpMessage);
  ::std::__cxx11::string::string((string *)&local_290,"[selected]",(allocator *)&local_238);
  StringUtils::replaceAll(&local_258,&local_1d8,&local_290,(string *)local_260);
  ::std::__cxx11::string::operator=((string *)helpMessage,(string *)&local_258);
  ::std::__cxx11::string::~string((string *)&local_258);
  ::std::__cxx11::string::~string((string *)&local_290);
  ::std::__cxx11::string::~string((string *)&local_1d8);
  ::std::__cxx11::string::string((string *)&local_1f8,(string *)helpMessage);
  ::std::__cxx11::string::string((string *)&local_290,"[envVarName]",(allocator *)&local_238);
  StringUtils::replaceAll(&local_258,&local_1f8,&local_290,(string *)local_268);
  ::std::__cxx11::string::operator=((string *)helpMessage,(string *)&local_258);
  ::std::__cxx11::string::~string((string *)&local_258);
  ::std::__cxx11::string::~string((string *)&local_290);
  ::std::__cxx11::string::~string((string *)&local_1f8);
  ::std::__cxx11::string::string((string *)&local_218,(string *)helpMessage);
  ::std::__cxx11::string::string((string *)&local_290,"[known]",&local_291);
  __return_storage_ptr___00 = local_270;
  ::std::__cxx11::stringbuf::str();
  StringUtils::replaceAll(&local_258,&local_218,&local_290,&local_238);
  topAndTailHelpMessage(__return_storage_ptr___00,(string *)&local_258);
  ::std::__cxx11::string::~string((string *)&local_258);
  ::std::__cxx11::string::~string((string *)&local_238);
  ::std::__cxx11::string::~string((string *)&local_290);
  ::std::__cxx11::string::~string((string *)&local_218);
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr___00;
}

Assistant:

std::string HelpMessages::envVarErrorMessage(const std::string& envVarName,
                                                 const std::string& selected,
                                                 const std::vector<std::string>& knowns,
                                                 std::string& helpMessage)
    {
        std::stringstream ss;
        for (auto& known : knowns)
        {
            ss << "* " << known << '\n';
        }
        helpMessage = StringUtils::replaceAll(helpMessage, "[selected]", selected);
        helpMessage = StringUtils::replaceAll(helpMessage, "[envVarName]", envVarName);
        return topAndTailHelpMessage(
            StringUtils::replaceAll(helpMessage, "[known]", ss.str()));
    }